

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringView.cpp
# Opt level: O3

Array3<BasicStringView<char>_> * __thiscall
Corrade::Containers::BasicStringView<char>::partition
          (Array3<BasicStringView<char>_> *__return_storage_ptr__,BasicStringView<char> *this,
          StringView separator)

{
  char *data;
  char *end;
  ulong substringSize;
  ulong size;
  BasicStringView<char> BVar1;
  BasicStringView<char> BVar2;
  BasicStringView<char> BVar3;
  
  substringSize = separator._sizePlusFlags & 0x3fffffffffffffff;
  data = this->_data;
  BVar1 = *this;
  size = this->_sizePlusFlags & 0x3fffffffffffffff;
  end = Implementation::stringFindString(data,size,separator._data,substringSize);
  if (end == (char *)0x0) {
    BVar2 = slice(this,size,size);
    BVar3 = slice(this,size,this->_sizePlusFlags & 0x3fffffffffffffff);
  }
  else {
    BVar1 = slice(this,data,end);
    BVar2 = slice(this,end,end + substringSize);
    BVar3 = slice(this,end + substringSize,this->_data + (this->_sizePlusFlags & 0x3fffffffffffffff)
                 );
  }
  (__return_storage_ptr__->
  super_StaticArrayDataFor<3UL,_Corrade::Containers::BasicStringView<char>_>).field_0._data[0] =
       BVar1;
  (__return_storage_ptr__->
  super_StaticArrayDataFor<3UL,_Corrade::Containers::BasicStringView<char>_>).field_0._data[1] =
       BVar2;
  (__return_storage_ptr__->
  super_StaticArrayDataFor<3UL,_Corrade::Containers::BasicStringView<char>_>).field_0._data[2] =
       BVar3;
  return __return_storage_ptr__;
}

Assistant:

Array3<BasicStringView<T>> BasicStringView<T>::partition(const StringView separator) const {
    /** @todo use findOr(StringView) for this, this has an awful lot of
        branches */

    const char* const separatorData = separator.data();
    const std::size_t separatorSize = separator.size();
    const std::size_t size = this->size();
    T* const pos = const_cast<T*>(Implementation::stringFindString(_data, size, separatorData, separatorSize));
    return {
        pos ? prefix(pos) : *this,
        pos ? slice(pos, pos + separatorSize) : exceptPrefix(size),
        pos ? suffix(pos + separatorSize) : exceptPrefix(size)
    };
}